

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

void buffer_register_mmt_write(mmt_write *w)

{
  uint32_t id_00;
  int iVar1;
  cpu_mapping *mapping_00;
  cpu_mapping *mapping;
  uint32_t id;
  mmt_write *w_local;
  
  id_00 = w->id;
  mapping_00 = get_cpu_mapping(id_00);
  if (mapping_00 == (cpu_mapping *)0x0) {
    fprintf(_stdout,"ERROR: buffer %d does not exist\n",(ulong)id_00);
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
    demmt_abort();
  }
  if (mapping_00->length < (ulong)(w->offset + (uint)w->len)) {
    fprintf(_stdout,"ERROR: buffer %d is too small (%ld) for write starting at %d and length %d\n",
            (ulong)mapping_00->id,mapping_00->length,(ulong)w->offset,(ulong)w->len);
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
    demmt_abort();
  }
  if (mapping_00->data == (uint8_t *)0x0) {
    fprintf(_stdout,"ERROR: buffer %d does not have data(?)\n",(ulong)id_00);
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
    demmt_abort();
  }
  memcpy(mapping_00->data + w->offset,w + 1,(ulong)w->len);
  if ((mapping_00->object != (gpu_object *)0x0) &&
     (iVar1 = regions_add_range(&mapping_00->object->written_regions,
                                w->offset + (int)mapping_00->object_offset,(uint)w->len), iVar1 == 0
     )) {
    demmt_abort();
  }
  buffer_decode_register_write(mapping_00,w->offset,(uint)w->len);
  return;
}

Assistant:

void buffer_register_mmt_write(struct mmt_write *w)
{
	uint32_t id = w->id;

	struct cpu_mapping *mapping = get_cpu_mapping(id);
	if (mapping == NULL)
	{
		mmt_error("buffer %d does not exist\n", id);
		demmt_abort();
	}

	if (mapping->length < w->offset + w->len)
	{
		mmt_error("buffer %d is too small (%" PRId64 ") for write starting at %d and length %d\n",
				mapping->id, mapping->length, w->offset, w->len);
		demmt_abort();
	}

	if (mapping->data == NULL)
	{
		mmt_error("buffer %d does not have data(?)\n", id);
		demmt_abort();
	}
	memcpy(mapping->data + w->offset, w->data, w->len);

	if (mapping->object)
		if (!regions_add_range(&mapping->object->written_regions, w->offset + mapping->object_offset, w->len))
			demmt_abort();

	buffer_decode_register_write(mapping, w->offset, w->len);
}